

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5ExprNodeTest_AND(Fts5Expr *pExpr,Fts5ExprNode *pAnd)

{
  Fts5ExprNode *pFVar1;
  bool bVar2;
  int iVar3;
  int cmp;
  Fts5ExprNode *pChild;
  int bMatch;
  int rc;
  i64 iLast;
  int iChild;
  Fts5ExprNode *pAnd_local;
  Fts5Expr *pExpr_local;
  
  _bMatch = pAnd->iRowid;
  do {
    pAnd->bNomatch = 0;
    bVar2 = true;
    for (iLast._4_4_ = 0; iLast._4_4_ < pAnd->nChild; iLast._4_4_ = iLast._4_4_ + 1) {
      pFVar1 = pAnd->apChild[iLast._4_4_];
      iVar3 = fts5RowidCmp(pExpr,_bMatch,pFVar1->iRowid);
      if ((0 < iVar3) && (iVar3 = (*pFVar1->xNext)(pExpr,pFVar1,1,_bMatch), iVar3 != 0)) {
        pAnd->bNomatch = 0;
        return iVar3;
      }
      if (pFVar1->bEof != 0) {
        fts5ExprSetEof(pAnd);
        bVar2 = true;
        break;
      }
      if (_bMatch != pFVar1->iRowid) {
        bVar2 = false;
        _bMatch = pFVar1->iRowid;
      }
      if (pFVar1->bNomatch != 0) {
        pAnd->bNomatch = 1;
      }
    }
    if (bVar2) {
      if ((pAnd->bNomatch != 0) && (pAnd != pExpr->pRoot)) {
        fts5ExprNodeZeroPoslist(pAnd);
      }
      pAnd->iRowid = _bMatch;
      return 0;
    }
  } while( true );
}

Assistant:

static int fts5ExprNodeTest_AND(
  Fts5Expr *pExpr,                /* Expression pPhrase belongs to */
  Fts5ExprNode *pAnd              /* FTS5_AND node to advance */
){
  int iChild;
  i64 iLast = pAnd->iRowid;
  int rc = SQLITE_OK;
  int bMatch;

  assert( pAnd->bEof==0 );
  do {
    pAnd->bNomatch = 0;
    bMatch = 1;
    for(iChild=0; iChild<pAnd->nChild; iChild++){
      Fts5ExprNode *pChild = pAnd->apChild[iChild];
      int cmp = fts5RowidCmp(pExpr, iLast, pChild->iRowid);
      if( cmp>0 ){
        /* Advance pChild until it points to iLast or laster */
        rc = fts5ExprNodeNext(pExpr, pChild, 1, iLast);
        if( rc!=SQLITE_OK ){
          pAnd->bNomatch = 0;
          return rc;
        }
      }

      /* If the child node is now at EOF, so is the parent AND node. Otherwise,
      ** the child node is guaranteed to have advanced at least as far as
      ** rowid iLast. So if it is not at exactly iLast, pChild->iRowid is the
      ** new lastest rowid seen so far.  */
      assert( pChild->bEof || fts5RowidCmp(pExpr, iLast, pChild->iRowid)<=0 );
      if( pChild->bEof ){
        fts5ExprSetEof(pAnd);
        bMatch = 1;
        break;
      }else if( iLast!=pChild->iRowid ){
        bMatch = 0;
        iLast = pChild->iRowid;
      }

      if( pChild->bNomatch ){
        pAnd->bNomatch = 1;
      }
    }
  }while( bMatch==0 );

  if( pAnd->bNomatch && pAnd!=pExpr->pRoot ){
    fts5ExprNodeZeroPoslist(pAnd);
  }
  pAnd->iRowid = iLast;
  return SQLITE_OK;
}